

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

optional_idx __thiscall
duckdb::GroupedAggregateHashTable::TryAddCompressedGroups
          (GroupedAggregateHashTable *this,DataChunk *groups,DataChunk *payload,
          unsafe_vector<idx_t> *filter)

{
  bool bVar1;
  optional_idx oVar2;
  reference pvVar3;
  
  bVar1 = DataChunk::AllConstant(groups);
  if (bVar1) {
    oVar2 = TryAddConstantGroups(this,groups,payload,filter);
    return (optional_idx)oVar2.index;
  }
  if ((long)(groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x68) {
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&groups->data,0);
    if (pvVar3->vector_type == DICTIONARY_VECTOR) {
      oVar2 = TryAddDictionaryGroups(this,groups,payload,filter);
      return (optional_idx)oVar2.index;
    }
  }
  return (optional_idx)0xffffffffffffffff;
}

Assistant:

optional_idx GroupedAggregateHashTable::TryAddCompressedGroups(DataChunk &groups, DataChunk &payload,
                                                               const unsafe_vector<idx_t> &filter) {
	// all groups must be compressed
	if (groups.AllConstant()) {
		return TryAddConstantGroups(groups, payload, filter);
	}
	if (groups.ColumnCount() == 1 && groups.data[0].GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		return TryAddDictionaryGroups(groups, payload, filter);
	}
	return optional_idx();
}